

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **args)

{
  bool bVar1;
  DIR *__dirp;
  dirent *pdVar2;
  char *__name;
  ostream *poVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string name;
  stringstream path;
  ostream local_1a8 [376];
  
  if (argc < 2) {
    poVar3 = (ostream *)&std::cerr;
    __name = "Usage: MP3Encoder <directory name>";
  }
  else {
    __name = args[1];
    __dirp = opendir(__name);
    if (__dirp != (DIR *)0x0) {
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pdVar2->d_name,(allocator<char> *)&path);
        bVar1 = std::operator==(&name,".");
        if ((!bVar1) && (bVar1 = std::operator==(&name,".."), !bVar1)) {
          std::__cxx11::stringstream::stringstream((stringstream *)&path);
          poVar3 = std::operator<<(local_1a8,__name);
          poVar3 = std::operator<<(poVar3,"/");
          std::operator<<(poVar3,(string *)&name);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218
                     ,&local_1f8);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::stringstream::~stringstream((stringstream *)&path);
        }
        std::__cxx11::string::~string((string *)&name);
      }
      closedir(__dirp);
      mp3_encoder::parallel_encoder::run(&local_218);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_218);
      return 0;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open directory ");
  }
  poVar3 = std::operator<<(poVar3,__name);
  std::endl<char,std::char_traits<char>>(poVar3);
  return 1;
}

Assistant:

int main(int argc, char** args)
{
    if (argc < 2)
    {
        std::cerr << "Usage: MP3Encoder <directory name>" << std::endl;
        return 1;
    }

    auto const dirName = args[1];
    auto const dir = opendir(dirName);
    if (!dir)
    {
        std::cerr << "Failed to open directory " << dirName << std::endl;
        return 1;
    }

    auto paths = std::vector<std::string>{};

    for (dirent* dirent = nullptr; (dirent = readdir(dir)) != nullptr;)
    {
        auto const name = std::string{dirent->d_name};
        if ((name == ".") || (name == ".."))
        {
            continue;
        }

        auto path = std::stringstream{};
        path << dirName << "/" << name;

        paths.push_back(path.str());
    }

    closedir(dir);

    mp3_encoder::parallel_encoder::run(paths);

    return 0;
}